

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
          (kj *this,Canceler *adapterConstructorParams,Promise<void> *adapterConstructorParams_1)

{
  Canceler *params;
  Promise<void> *params_1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Promise<void>_> *local_20;
  Promise<void> *adapterConstructorParams_local_1;
  Canceler *adapterConstructorParams_local;
  
  local_20 = adapterConstructorParams_1;
  adapterConstructorParams_local_1 = (Promise<void> *)adapterConstructorParams;
  adapterConstructorParams_local = (Canceler *)this;
  params = fwd<kj::Canceler&>(adapterConstructorParams);
  params_1 = fwd<kj::Promise<void>>(local_20);
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::Canceler&,kj::Promise<void>>
            ((kj *)&local_40,params,params_1);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,void>
            (&local_30,&local_40);
  Promise<void>::Promise((Promise<void> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_>::~Own(&local_40);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}